

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-and-recv.c
# Opt level: O2

int run_test_udp_send_and_recv(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b;
  undefined8 local_168;
  sockaddr_in addr;
  uv_udp_send_t req;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  req.data = (void *)(long)iVar1;
  eval_b = 0;
  if (req.data == (void *)0x0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_udp_init(uVar2,&server);
    req.data = (void *)(long)iVar1;
    eval_b = 0;
    if (req.data == (void *)0x0) {
      iVar1 = uv_udp_bind(&server,&addr,0);
      req.data = (void *)(long)iVar1;
      eval_b = 0;
      if (req.data == (void *)0x0) {
        iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
        req.data = (void *)(long)iVar1;
        eval_b = 0;
        if (req.data == (void *)0x0) {
          iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
          req.data = (void *)(long)iVar1;
          eval_b = 0;
          if (req.data == (void *)0x0) {
            uVar2 = uv_default_loop();
            iVar1 = uv_udp_init(uVar2,&client);
            req.data = (void *)(long)iVar1;
            eval_b = 0;
            if (req.data == (void *)0x0) {
              auVar5 = uv_buf_init("PING",4);
              local_168 = auVar5._8_8_;
              eval_b = auVar5._0_8_;
              iVar1 = uv_udp_send(&req,&client,&eval_b,1,&addr,cl_send_cb);
              eval_a_6 = (int64_t)iVar1;
              eval_b_6 = 0;
              if ((void *)eval_a_6 == (void *)0x0) {
                eval_a_6 = (int64_t)close_cb_called;
                eval_b_6 = 0;
                if ((void *)eval_a_6 == (void *)0x0) {
                  eval_a_6 = (int64_t)cl_send_cb_called;
                  eval_b_6 = 0;
                  if ((void *)eval_a_6 == (void *)0x0) {
                    eval_a_6 = (int64_t)cl_recv_cb_called;
                    eval_b_6 = 0;
                    if ((void *)eval_a_6 == (void *)0x0) {
                      eval_a_6 = (int64_t)sv_send_cb_called;
                      eval_b_6 = 0;
                      if ((void *)eval_a_6 == (void *)0x0) {
                        eval_a_6 = (int64_t)sv_recv_cb_called;
                        eval_b_6 = 0;
                        if ((void *)eval_a_6 == (void *)0x0) {
                          uVar2 = uv_default_loop();
                          uv_run(uVar2,0);
                          eval_a_6 = 1;
                          eval_b_6 = (int64_t)cl_send_cb_called;
                          if (eval_b_6 == 1) {
                            eval_a_6 = 1;
                            eval_b_6 = (int64_t)cl_recv_cb_called;
                            if (eval_b_6 == 1) {
                              eval_a_6 = 1;
                              eval_b_6 = (int64_t)sv_send_cb_called;
                              if (eval_b_6 == 1) {
                                eval_a_6 = 1;
                                eval_b_6 = (int64_t)sv_recv_cb_called;
                                if (eval_b_6 == 1) {
                                  eval_a_6 = 2;
                                  eval_b_6 = (int64_t)close_cb_called;
                                  if (eval_b_6 == 2) {
                                    eval_b_6 = 0;
                                    if (client.send_queue_size == 0) {
                                      eval_b_6 = 0;
                                      if (server.send_queue_size == 0) {
                                        uVar2 = uv_default_loop();
                                        uv_walk(uVar2,close_walk_cb,0);
                                        uv_run(uVar2,0);
                                        eval_a_6 = 0;
                                        uVar2 = uv_default_loop();
                                        iVar1 = uv_loop_close(uVar2);
                                        eval_b_6 = (int64_t)iVar1;
                                        if (eval_b_6 == 0) {
                                          uv_library_shutdown();
                                          return 0;
                                        }
                                        pcVar4 = "uv_loop_close(uv_default_loop())";
                                        pcVar3 = "0";
                                        uVar2 = 0xd2;
                                      }
                                      else {
                                        pcVar4 = "0";
                                        pcVar3 = "server.send_queue_size";
                                        uVar2 = 0xd0;
                                        eval_a_6 = server.send_queue_size;
                                      }
                                    }
                                    else {
                                      pcVar4 = "0";
                                      pcVar3 = "client.send_queue_size";
                                      uVar2 = 0xcf;
                                      eval_a_6 = client.send_queue_size;
                                    }
                                  }
                                  else {
                                    pcVar4 = "close_cb_called";
                                    pcVar3 = "2";
                                    uVar2 = 0xcd;
                                  }
                                }
                                else {
                                  pcVar4 = "sv_recv_cb_called";
                                  pcVar3 = "1";
                                  uVar2 = 0xcc;
                                }
                              }
                              else {
                                pcVar4 = "sv_send_cb_called";
                                pcVar3 = "1";
                                uVar2 = 0xcb;
                              }
                            }
                            else {
                              pcVar4 = "cl_recv_cb_called";
                              pcVar3 = "1";
                              uVar2 = 0xca;
                            }
                          }
                          else {
                            pcVar4 = "cl_send_cb_called";
                            pcVar3 = "1";
                            uVar2 = 0xc9;
                          }
                        }
                        else {
                          pcVar4 = "0";
                          pcVar3 = "sv_recv_cb_called";
                          uVar2 = 0xc5;
                        }
                      }
                      else {
                        pcVar4 = "0";
                        pcVar3 = "sv_send_cb_called";
                        uVar2 = 0xc4;
                      }
                    }
                    else {
                      pcVar4 = "0";
                      pcVar3 = "cl_recv_cb_called";
                      uVar2 = 0xc3;
                    }
                  }
                  else {
                    pcVar4 = "0";
                    pcVar3 = "cl_send_cb_called";
                    uVar2 = 0xc2;
                  }
                }
                else {
                  pcVar4 = "0";
                  pcVar3 = "close_cb_called";
                  uVar2 = 0xc1;
                }
              }
              else {
                pcVar4 = "0";
                pcVar3 = "r";
                uVar2 = 0xbf;
              }
              goto LAB_001ac885;
            }
            pcVar3 = "r";
            uVar2 = 0xb4;
          }
          else {
            pcVar3 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
            uVar2 = 0xb1;
          }
        }
        else {
          pcVar3 = "r";
          uVar2 = 0xaf;
        }
      }
      else {
        pcVar3 = "r";
        uVar2 = 0xac;
      }
    }
    else {
      pcVar3 = "r";
      uVar2 = 0xa9;
    }
  }
  else {
    pcVar3 = "uv_ip4_addr(\"0.0.0.0\", 9123, &addr)";
    uVar2 = 0xa6;
  }
  eval_b = 0;
  pcVar4 = "0";
  eval_b_6 = 0;
  eval_a_6 = (int64_t)req.data;
LAB_001ac885:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a_6,"==",eval_b_6);
  abort();
}

Assistant:

TEST_IMPL(udp_send_and_recv) {
  struct sockaddr_in addr;
  uv_udp_send_t req;
  uv_buf_t buf;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  /* client sends "PING", expects "PONG" */
  buf = uv_buf_init("PING", 4);

  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);
  ASSERT_OK(cl_send_cb_called);
  ASSERT_OK(cl_recv_cb_called);
  ASSERT_OK(sv_send_cb_called);
  ASSERT_OK(sv_recv_cb_called);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, cl_send_cb_called);
  ASSERT_EQ(1, cl_recv_cb_called);
  ASSERT_EQ(1, sv_send_cb_called);
  ASSERT_EQ(1, sv_recv_cb_called);
  ASSERT_EQ(2, close_cb_called);

  ASSERT_OK(client.send_queue_size);
  ASSERT_OK(server.send_queue_size);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}